

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

void DynamicProfileStorage::ClearCacheCatalog(void)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool success;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x3f4,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr();
    *puVar3 = 0;
  }
  if ((useCacheDir & 1U) == 0) {
    ClearInfoMap(false);
  }
  else {
    bVar2 = AcquireLock();
    if (bVar2) {
      bVar2 = CreateCacheCatalog();
      ReleaseLock();
      if ((bVar2) && (bVar2 = DoTrace(), bVar2)) {
        Output::Print(L"TRACE: DynamicProfileStorage: Cache dir clears\n");
        Output::Flush();
      }
    }
  }
  return;
}

Assistant:

void DynamicProfileStorage::ClearCacheCatalog()
{
    AssertOrFailFast(enabled);
    if (useCacheDir)
    {
        if (!AcquireLock())
        {
            return;
        }
        bool success = CreateCacheCatalog();
        ReleaseLock();
        if (success)
        {
#if DBG_DUMP
            if (DynamicProfileStorage::DoTrace())
            {
                Output::Print(_u("TRACE: DynamicProfileStorage: Cache dir clears\n"));
                Output::Flush();
            }
#endif
            return;
        }
    }
    else
    {
        ClearInfoMap(false);
    }
}